

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O0

int Storage::Tape::MSX::Parser::get_byte(FileSpeed *speed,BinaryTapePlayer *tape_player)

{
  byte bVar1;
  float fVar2;
  BinaryTapePlayer *this;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  element_type *peVar7;
  IntType IVar8;
  IntType IVar9;
  float *pfVar10;
  undefined1 local_d0 [16];
  undefined1 local_c0 [24];
  int required_transitions;
  int next_bit;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  float local_90;
  uint local_8c;
  int cycles_to_run_for;
  int cycles_until_next_event;
  uint local_78;
  uint local_74;
  int cycles_remaining;
  int transitions;
  byte local_59;
  float local_58;
  uint uStack_54;
  bool level;
  int bits_left;
  int cycles_per_window;
  int result;
  float duration;
  bool level_1;
  undefined1 local_38 [24];
  int input;
  float minimum_start_bit_duration;
  BinaryTapePlayer *tape_player_local;
  FileSpeed *speed_local;
  
  _input = tape_player;
  tape_player_local = (BinaryTapePlayer *)speed;
  bVar3 = BinaryTapePlayer::get_motor_control(tape_player);
  if (bVar3) {
    local_38._20_4_ =
         (float)*(byte *)&(tape_player_local->super_TapePlayer).super_TimedEventLoop.
                          _vptr_TimedEventLoop * 1.145e-05 * 0.5;
    local_38._16_4_ = 0;
    do {
      TapePlayer::get_tape((TapePlayer *)local_38);
      peVar7 = std::
               __shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
      iVar5 = (**peVar7->_vptr_Tape)();
      std::shared_ptr<Storage::Tape::Tape>::~shared_ptr((shared_ptr<Storage::Tape::Tape> *)local_38)
      ;
      if ((((byte)iVar5 ^ 0xff) & 1) == 0) break;
      result._3_1_ = BinaryTapePlayer::get_input(_input);
      cycles_per_window = 0;
      while (bVar3 = (bool)(result._3_1_ & 1), bVar4 = BinaryTapePlayer::get_input(_input),
            bVar3 == bVar4) {
        IVar9 = TimedEventLoop::get_cycles_until_next_event((TimedEventLoop *)_input);
        IVar8 = TimedEventLoop::get_input_clock_rate((TimedEventLoop *)_input);
        cycles_per_window = (int)((float)IVar9 / (float)IVar8 + (float)cycles_per_window);
        TapePlayer::run_for_input_pulse(&_input->super_TapePlayer);
      }
      local_38._16_4_ = local_38._16_4_ << 1;
      if ((float)local_38._20_4_ <= (float)cycles_per_window) {
        local_38._16_4_ = local_38._16_4_ | 1;
      }
    } while ((local_38._16_4_ & 3) != 3);
    bits_left = 0;
    bVar1 = *(byte *)((long)&(tape_player_local->super_TapePlayer).super_TimedEventLoop.
                             _vptr_TimedEventLoop + 1);
    IVar9 = TimedEventLoop::get_input_clock_rate((TimedEventLoop *)_input);
    uStack_54 = (uint)((float)bVar1 * 1.73e-05 * (float)IVar9 + 0.5);
    local_58 = 1.12104e-44;
    local_59 = BinaryTapePlayer::get_input(_input);
    do {
      TapePlayer::get_tape((TapePlayer *)&cycles_remaining);
      peVar7 = std::
               __shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&cycles_remaining);
      uVar6 = (**peVar7->_vptr_Tape)();
      fVar2 = local_58;
      bVar3 = (uVar6 & 1) == 0;
      if (bVar3) {
        local_58 = (float)((int)local_58 + -1);
      }
      std::shared_ptr<Storage::Tape::Tape>::~shared_ptr
                ((shared_ptr<Storage::Tape::Tape> *)&cycles_remaining);
      if (!bVar3 || fVar2 == 0.0) {
        return bits_left;
      }
      local_74 = 0;
      local_78 = uStack_54;
      while( true ) {
        TapePlayer::get_tape((TapePlayer *)&cycles_to_run_for);
        peVar7 = std::
                 __shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&cycles_to_run_for);
        uVar6 = (**peVar7->_vptr_Tape)();
        bVar3 = local_78 == 0;
        std::shared_ptr<Storage::Tape::Tape>::~shared_ptr
                  ((shared_ptr<Storage::Tape::Tape> *)&cycles_to_run_for);
        if ((uVar6 & 1) != 0 || bVar3) break;
        IVar9 = TimedEventLoop::get_cycles_until_next_event((TimedEventLoop *)_input);
        local_8c = (uint)IVar9;
        pfVar10 = (float *)std::min<int>((int *)&local_8c,(int *)&local_78);
        this = _input;
        local_90 = *pfVar10;
        local_78 = local_78 - (int)local_90;
        Cycles::Cycles((Cycles *)&local_98,(long)(int)local_90);
        BinaryTapePlayer::run_for(this,(Cycles)local_98._M_pi);
        bVar3 = (bool)(local_59 & 1);
        bVar4 = BinaryTapePlayer::get_input(_input);
        if (bVar3 != bVar4) {
          local_59 = BinaryTapePlayer::get_input(_input);
          local_74 = local_74 + 1;
        }
      }
      TapePlayer::get_tape((TapePlayer *)&required_transitions);
      peVar7 = std::
               __shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&required_transitions);
      uVar6 = (**peVar7->_vptr_Tape)();
      std::shared_ptr<Storage::Tape::Tape>::~shared_ptr
                ((shared_ptr<Storage::Tape::Tape> *)&required_transitions);
      if ((uVar6 & 1) != 0) {
        return -1;
      }
      if (local_74 < 2) {
        local_c0._20_4_ = 0;
      }
      else {
        if (1 < local_74 - 2) {
          return -1;
        }
        local_c0._20_4_ = 0x80;
      }
      bits_left = bits_left >> 1 | local_c0._20_4_;
      local_c0._16_4_ = 2 - (local_74 & 1);
      do {
        do {
          TapePlayer::get_tape((TapePlayer *)local_c0);
          peVar7 = std::
                   __shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_c0);
          iVar5 = (**peVar7->_vptr_Tape)();
          std::shared_ptr<Storage::Tape::Tape>::~shared_ptr
                    ((shared_ptr<Storage::Tape::Tape> *)local_c0);
          if ((((byte)iVar5 ^ 0xff) & 1) == 0) goto LAB_009ba6d3;
          TapePlayer::run_for_input_pulse(&_input->super_TapePlayer);
          bVar3 = (bool)(local_59 & 1);
          bVar4 = BinaryTapePlayer::get_input(_input);
        } while (bVar3 == bVar4);
        local_59 = BinaryTapePlayer::get_input(_input);
        local_c0._16_4_ = local_c0._16_4_ + -1;
      } while (local_c0._16_4_ != 0);
LAB_009ba6d3:
      TapePlayer::get_tape((TapePlayer *)local_d0);
      peVar7 = std::
               __shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_d0);
      uVar6 = (**peVar7->_vptr_Tape)();
      std::shared_ptr<Storage::Tape::Tape>::~shared_ptr((shared_ptr<Storage::Tape::Tape> *)local_d0)
      ;
    } while ((uVar6 & 1) == 0);
  }
  return -1;
}

Assistant:

int Parser::get_byte(const FileSpeed &speed, Storage::Tape::BinaryTapePlayer &tape_player) {
	if(!tape_player.get_motor_control()) {
		return -1;
	}

	/*
		"The cassette is first read continuously until a start bit is found.
		This is done by locating a negative transition, measuring the following
		cycle length (1B1FH) and comparing this to see if it is greater than LOWLIM."

		... but I don't buy that, as it makes the process overly dependent on phase.
		So I'm going to look for the next two consecutive pulses that are each big
		enough to be half of a zero.
	*/
	const float minimum_start_bit_duration = float(speed.minimum_start_bit_duration) * 0.00001145f * 0.5f;
	int input = 0;
	while(!tape_player.get_tape()->is_at_end()) {
		// Find next transition.
		bool level = tape_player.get_input();
		float duration = 0.0;
		while(level == tape_player.get_input()) {
			duration += float(tape_player.get_cycles_until_next_event()) / float(tape_player.get_input_clock_rate());
			tape_player.run_for_input_pulse();
		}

		input = (input << 1);
		if(duration >= minimum_start_bit_duration) input |= 1;
		if((input&3) == 3) break;
	}

	/*
		"Each of the eight data bits is then read by counting the number of transitions within
		a fixed period of time (1B03H). If zero or one transitions are found it is a 0 bit, if two
		or three are found it is a 1 bit. If more than three transitions are found the routine
		terminates with Flag C as this is presumed to be a hardware error of some sort."
	*/
	int result = 0;
	const int cycles_per_window = int(
		0.5f +
		float(speed.low_high_disrimination_duration) *
		0.0000173f *
		float(tape_player.get_input_clock_rate())
	);
	int bits_left = 8;
	bool level = tape_player.get_input();
	while(!tape_player.get_tape()->is_at_end() && bits_left--) {
		// Count number of transitions within cycles_per_window.
		int transitions = 0;
		int cycles_remaining = cycles_per_window;
		while(!tape_player.get_tape()->is_at_end() && cycles_remaining) {
			const int cycles_until_next_event = int(tape_player.get_cycles_until_next_event());
			const int cycles_to_run_for = std::min(cycles_until_next_event, cycles_remaining);

			cycles_remaining -= cycles_to_run_for;
			tape_player.run_for(Cycles(cycles_to_run_for));

			if(level != tape_player.get_input()) {
				level = tape_player.get_input();
				transitions++;
			}
		}

		if(tape_player.get_tape()->is_at_end()) return -1;

		int next_bit = 0;
		switch(transitions) {
			case 0: case 1:
				next_bit = 0x00;
			break;
			case 2: case 3:
				next_bit = 0x80;
			break;
			default:
			return -1;
		}
		result = (result >> 1) | next_bit;

		/*
			"After the value of each bit has been determined a further one or two transitions are read (1B23H)
			to retain synchronization. With an odd transition count one more will be read, with an even
			transition count two more."
		*/
		int required_transitions = 2 - (transitions&1);
		while(!tape_player.get_tape()->is_at_end()) {
			tape_player.run_for_input_pulse();
			if(level != tape_player.get_input()) {
				level = tape_player.get_input();
				required_transitions--;
				if(!required_transitions) break;
			}
		}

		if(tape_player.get_tape()->is_at_end()) return -1;
	}
	return result;
}